

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write_exponent<char,fmt::v11::basic_appender<char>>
          (int exp,basic_appender<char> out)

{
  char cVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)exp;
  uVar4 = (out.container)->size_ + 1;
  if (exp < 0) {
    if ((out.container)->capacity_ < uVar4) {
      (*(out.container)->grow_)(out.container,uVar4);
    }
    sVar2 = (out.container)->size_;
    (out.container)->size_ = sVar2 + 1;
    (out.container)->ptr_[sVar2] = '-';
    uVar5 = (ulong)(uint)-exp;
  }
  else {
    if ((out.container)->capacity_ < uVar4) {
      (*(out.container)->grow_)(out.container,uVar4);
    }
    sVar2 = (out.container)->size_;
    (out.container)->size_ = sVar2 + 1;
    (out.container)->ptr_[sVar2] = '+';
  }
  uVar3 = (uint)uVar5;
  if (99 < uVar3) {
    if (999 < uVar3) {
      cVar1 = digits2(unsigned_long)::data[(uVar5 / 100) * 2];
      uVar4 = (out.container)->size_ + 1;
      if ((out.container)->capacity_ < uVar4) {
        (*(out.container)->grow_)(out.container,uVar4);
      }
      sVar2 = (out.container)->size_;
      (out.container)->size_ = sVar2 + 1;
      (out.container)->ptr_[sVar2] = cVar1;
    }
    cVar1 = digits2(unsigned_long)::data[(uVar5 / 100) * 2 + 1];
    uVar4 = (out.container)->size_ + 1;
    if ((out.container)->capacity_ < uVar4) {
      (*(out.container)->grow_)(out.container,uVar4);
    }
    uVar3 = uVar3 + (int)(uVar5 / 100) * -100;
    sVar2 = (out.container)->size_;
    (out.container)->size_ = sVar2 + 1;
    (out.container)->ptr_[sVar2] = cVar1;
  }
  cVar1 = digits2(unsigned_long)::data[(ulong)uVar3 * 2];
  uVar5 = (out.container)->size_ + 1;
  if ((out.container)->capacity_ < uVar5) {
    (*(out.container)->grow_)(out.container,uVar5);
  }
  sVar2 = (out.container)->size_;
  (out.container)->size_ = sVar2 + 1;
  (out.container)->ptr_[sVar2] = cVar1;
  cVar1 = digits2(unsigned_long)::data[(ulong)uVar3 * 2 + 1];
  uVar5 = (out.container)->size_ + 1;
  if ((out.container)->capacity_ < uVar5) {
    (*(out.container)->grow_)(out.container,uVar5);
  }
  sVar2 = (out.container)->size_;
  (out.container)->size_ = sVar2 + 1;
  (out.container)->ptr_[sVar2] = cVar1;
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR auto write_exponent(int exp, OutputIt out) -> OutputIt {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *out++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *out++ = static_cast<Char>('+');
  }
  auto uexp = static_cast<uint32_t>(exp);
  if (is_constant_evaluated()) {
    if (uexp < 10) *out++ = '0';
    return format_decimal<Char>(out, uexp, count_digits(uexp));
  }
  if (uexp >= 100u) {
    const char* top = digits2(uexp / 100);
    if (uexp >= 1000u) *out++ = static_cast<Char>(top[0]);
    *out++ = static_cast<Char>(top[1]);
    uexp %= 100;
  }
  const char* d = digits2(uexp);
  *out++ = static_cast<Char>(d[0]);
  *out++ = static_cast<Char>(d[1]);
  return out;
}